

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void nh_generate_http_response(http_context_t *ctx)

{
  nh_stream_t *stream;
  nh_header_t *pnVar1;
  size_t sVar2;
  ulong uVar3;
  
  stream = &(ctx->response).raw;
  uVar3 = (ulong)(ctx->response).status;
  nh_stream_write(stream,"HTTP/1.1 %u %s\r\n",uVar3,nh_http_status[uVar3]);
  for (pnVar1 = (ctx->response).header; pnVar1 != (nh_header_t *)0x0; pnVar1 = pnVar1->next) {
    nh_stream_write(stream,"%s: %s\r\n",pnVar1->key,pnVar1->value);
  }
  if ((ctx->response).body.len != 0) {
    nh_stream_write(stream,"Content-Length: %zu\r\n");
  }
  nh_stream_write(stream,"\r\n");
  sVar2 = (ctx->response).body.len;
  if (sVar2 != 0) {
    nh_stream_copy(stream,(ctx->response).body.value,(uint32_t)sVar2);
    return;
  }
  return;
}

Assistant:

void nh_generate_http_response(http_context_t *ctx) {
    nh_stream_t *stream = &ctx->response.raw;
    nh_response_t *response = &ctx->response;

    // meta line
    nh_stream_write(stream, "HTTP/1.1 %u %s\r\n", response->status, nh_http_status[response->status]);

    // headers
    nh_header_t *header = response->header;
    while (header != NULL) {
        nh_stream_write(stream, "%s: %s\r\n", header->key, header->value);
        header = header->next;
    }
    // content-length
    if (response->body.len) {
        nh_stream_write(stream, "Content-Length: %zu\r\n", response->body.len);
    }
    nh_stream_write(stream, "\r\n");

    // body
    if (response->body.len) {
        nh_stream_copy(stream, response->body.value, response->body.len);
    }
}